

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O3

bool __thiscall
ON_BoundingBox::Intersection(ON_BoundingBox *this,ON_Line *line,double *t0,double *t1)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  ulong uVar4;
  bool bVar5;
  double dVar6;
  ON_Interval t;
  ON_Interval Li;
  ON_Interval ti;
  ON_Interval local_60;
  ON_Interval local_50;
  ON_Interval local_40;
  
  ON_Interval::ON_Interval(&local_60,-1.79769313486232e+308,1.79769313486232e+308);
  ON_Interval::ON_Interval(&local_40);
  ON_Interval::ON_Interval(&local_50);
  uVar4 = 0;
  bVar5 = false;
  do {
    dVar6 = (&(line->from).x)[uVar4];
    dVar2 = (&(line->to).x)[uVar4];
    if ((dVar6 != dVar2) || (NAN(dVar6) || NAN(dVar2))) {
      local_50.m_t[0] = dVar6;
      local_50.m_t[1] = dVar2;
      local_40.m_t[0] = ON_Interval::NormalizedParameterAt(&local_50,(&(this->m_min).x)[uVar4]);
      local_40.m_t[1] = ON_Interval::NormalizedParameterAt(&local_50,(&(this->m_max).x)[uVar4]);
      bVar3 = ON_Interval::Intersection(&local_60,&local_40);
      if (!bVar3) {
        return bVar5;
      }
    }
    else {
      if (dVar6 < (&(this->m_min).x)[uVar4]) {
        return bVar5;
      }
      pdVar1 = &(this->m_max).x + uVar4;
      if (*pdVar1 <= dVar6 && dVar6 != *pdVar1) {
        return bVar5;
      }
    }
    bVar5 = 1 < uVar4;
    uVar4 = uVar4 + 1;
    if (uVar4 == 3) {
      if (t0 != (double *)0x0) {
        dVar6 = ON_Interval::Min(&local_60);
        *t0 = dVar6;
      }
      if (t1 != (double *)0x0) {
        dVar6 = ON_Interval::Max(&local_60);
        *t1 = dVar6;
      }
      return true;
    }
  } while( true );
}

Assistant:

bool ON_BoundingBox::Intersection(				//Returns true when intersect is non-empty. 
				 const ON_Line& line,		//Infinite Line segment to intersect with 
				 double* t0 ,			// t0  parameter of first intersection point
				 double* t1       // t1  parameter of last intersection point (t0<=t1)   
				 ) const
{		 
	ON_Interval t(-ON_DBL_MAX, ON_DBL_MAX), ti, Li;
  const double* boxmin = &m_min.x;
  const double* boxmax = &m_max.x;
  const double* from   = &line.from.x;
  const double* to     = &line.to.x;
	for(int i=0; i<3; i++)
  {
		if( from[i] == to[i] )
    {
			if( from[i] < boxmin[i] || from[i] > boxmax[i] )
				return false;
		} 
    else 
    {
      Li.m_t[0] = from[i];
      Li.m_t[1] = to[i];
			ti.m_t[0] = Li.NormalizedParameterAt( boxmin[i]); 
			ti.m_t[1] = Li.NormalizedParameterAt( boxmax[i]);
			if ( !t.Intersection(ti) )
        return false;
		}
	}	

	if(t0)
		*t0 = t.Min();
	if(t1)
		*t1 = t.Max();
	return true;
}